

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_specific.cpp
# Opt level: O3

void * RoutineFunc(void *args)

{
  undefined4 uVar1;
  undefined4 *value;
  uint *value_00;
  
  co_enable_hook_sys();
  uVar1 = *(undefined4 *)((long)args + 8);
  if (_routine_init_stRoutineSpecificData_t == '\0') {
    pthread_once(&_routine_once_stRoutineSpecificData_t,_routine_make_key_stRoutineSpecificData_t);
    _routine_init_stRoutineSpecificData_t = '\x01';
  }
  value = (undefined4 *)co_getspecific(_routine_key_stRoutineSpecificData_t);
  if (value == (undefined4 *)0x0) {
    value = (undefined4 *)calloc(1,4);
    co_setspecific(_routine_key_stRoutineSpecificData_t,value);
  }
  *value = uVar1;
  do {
    if (_routine_init_stRoutineSpecificData_t == '\0') {
      pthread_once(&_routine_once_stRoutineSpecificData_t,_routine_make_key_stRoutineSpecificData_t)
      ;
      _routine_init_stRoutineSpecificData_t = '\x01';
    }
    value_00 = (uint *)co_getspecific(_routine_key_stRoutineSpecificData_t);
    if (value_00 == (uint *)0x0) {
      value_00 = (uint *)calloc(1,4);
      co_setspecific(_routine_key_stRoutineSpecificData_t,value_00);
    }
    printf("%s:%d routine specific data idx %d\n","RoutineFunc",0x2d,(ulong)*value_00);
    poll((pollfd *)0x0,0,1000);
  } while( true );
}

Assistant:

void* RoutineFunc(void* args)
{
	co_enable_hook_sys();
	stRoutineArgs_t* routine_args = (stRoutineArgs_t*)args;
	__routine->idx = routine_args->routine_id;
	while (true)
	{
		printf("%s:%d routine specific data idx %d\n", __func__, __LINE__, __routine->idx);
		poll(NULL, 0, 1000);
	}
	return NULL;
}